

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests> *
testing::internal::
CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests>,testing::internal::ParameterizedTestSuiteInfoBase>
          (ParameterizedTestSuiteInfoBase *base)

{
  bool bVar1;
  ostream *poVar2;
  ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests>
  *local_48;
  GTestLog local_14;
  ParameterizedTestSuiteInfoBase *local_10;
  ParameterizedTestSuiteInfoBase *base_local;
  
  local_10 = base;
  if (base == (ParameterizedTestSuiteInfoBase *)0x0) {
    __cxa_bad_typeid();
  }
  bVar1 = std::type_info::operator==
                    ((type_info *)base->_vptr_ParameterizedTestSuiteInfoBase[-1],
                     (type_info *)
                     &ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests>
                      ::typeinfo);
  bVar1 = IsTrue(bVar1);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x45a);
    poVar2 = GTestLog::GetStream(&local_14);
    std::operator<<(poVar2,"Condition typeid(*base) == typeid(Derived) failed. ");
    GTestLog::~GTestLog(&local_14);
  }
  if (local_10 == (ParameterizedTestSuiteInfoBase *)0x0) {
    local_48 = (ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests>
                *)0x0;
  }
  else {
    local_48 = (ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests>
                *)__dynamic_cast(local_10,&ParameterizedTestSuiteInfoBase::typeinfo,
                                 &ParameterizedTestSuiteInfo<solitaire::colliders::StockPileColliderGetCoveredCardsPositionTests>
                                  ::typeinfo,0);
  }
  return local_48;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
#if GTEST_HAS_RTTI
  GTEST_CHECK_(typeid(*base) == typeid(Derived));
#endif

#if GTEST_HAS_DOWNCAST_
  return ::down_cast<Derived*>(base);
#elif GTEST_HAS_RTTI
  return dynamic_cast<Derived*>(base);  // NOLINT
#else
  return static_cast<Derived*>(base);  // Poor man's downcast.
#endif
}